

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O0

ASN1_TYPE * ASN1_generate_v3(char *str,X509V3_CTX *cnf)

{
  int iVar1;
  cbb_st *pcVar2;
  size_t sVar3;
  uint8_t *local_60;
  uint8_t *der;
  undefined1 local_50 [8];
  ScopedCBB cbb;
  X509V3_CTX *cnf_local;
  char *str_local;
  
  cbb.ctx_.u._24_8_ = cnf;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
  pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
  iVar1 = CBB_init(pcVar2,0);
  if (iVar1 != 0) {
    pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
    iVar1 = generate_v3(pcVar2,str,(X509V3_CTX *)cbb.ctx_.u._24_8_,0,1,0);
    if (iVar1 != 0) {
      pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
      sVar3 = CBB_len(pcVar2);
      if (sVar3 < 0x10001) {
        pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
        local_60 = CBB_data(pcVar2);
        pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
        sVar3 = CBB_len(pcVar2);
        str_local = (char *)d2i_ASN1_TYPE((ASN1_TYPE **)0x0,&local_60,sVar3);
      }
      else {
        ERR_put_error(0xc,0,0xb1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x48);
        str_local = (char *)0x0;
      }
      goto LAB_008171ba;
    }
  }
  str_local = (char *)0x0;
LAB_008171ba:
  der._4_4_ = 1;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_50);
  return (ASN1_TYPE *)str_local;
}

Assistant:

ASN1_TYPE *ASN1_generate_v3(const char *str, const X509V3_CTX *cnf) {
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 0) ||  //
      !generate_v3(cbb.get(), str, cnf, /*tag=*/0, ASN1_GEN_FORMAT_ASCII,
                   /*depth=*/0)) {
    return nullptr;
  }

  // While not strictly necessary to avoid a DoS (we rely on any super-linear
  // checks being performed internally), cap the overall output to
  // |ASN1_GEN_MAX_OUTPUT| so the externally-visible behavior is consistent.
  if (CBB_len(cbb.get()) > ASN1_GEN_MAX_OUTPUT) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return nullptr;
  }

  const uint8_t *der = CBB_data(cbb.get());
  return d2i_ASN1_TYPE(nullptr, &der, CBB_len(cbb.get()));
}